

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[28],capnp::Text::Reader,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [28],Reader *params_1,
          char (*params_2) [3])

{
  char (*value) [28];
  Reader *value_00;
  char (*value_01) [3];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  Reader *local_28;
  char (*params_local_2) [3];
  Reader *params_local_1;
  char (*params_local) [28];
  
  local_28 = params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (Reader *)this;
  params_local = (char (*) [28])__return_storage_ptr__;
  value = ::const((char (*) [28])this);
  local_38 = toCharSequence<char_const(&)[28]>(value);
  value_00 = fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)params_local_2);
  local_48 = toCharSequence<capnp::Text::Reader>(value_00);
  value_01 = ::const((char (*) [3])local_28);
  local_58 = toCharSequence<char_const(&)[3]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}